

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

FeatureVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies
          (FeatureVector *__return_storage_ptr__,Feature feature)

{
  Feature *arg_list_end;
  undefined8 local_14;
  Feature local_c;
  
  arg_list_end = (Feature *)&stack0xfffffffffffffff8;
  switch(feature) {
  case SubgroupAllEqualT:
    arg_list_end = &local_c;
    local_14 = 0x700000005;
    break;
  case SubgroupElect:
    local_14 = 0xc00000006;
    local_c = SubgroupInvocationID;
    break;
  default:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    return __return_storage_ptr__;
  case SubgroupInverseBallot_InclBitCount_ExclBitCout:
    arg_list_end = (Feature *)((long)&local_14 + 4);
    local_14 = (ulong)local_14._4_4_ << 0x20;
    break;
  case SubgroupBallotBitCount:
    arg_list_end = (Feature *)((long)&local_14 + 4);
    local_14 = CONCAT44(local_14._4_4_,0xc);
  }
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::SmallVector
            (__return_storage_ptr__,(Feature *)&local_14,arg_list_end);
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureVector
CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies(Feature feature)
{
	switch (feature)
	{
	case SubgroupAllEqualT:
		return { SubgroupBrodcast_First, SubgroupAll_Any_AllEqualBool };
	case SubgroupElect:
		return { SubgroupBallotFindLSB_MSB, SubgroupBallot, SubgroupInvocationID };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return { SubgroupMask };
	case SubgroupBallotBitCount:
		return { SubgroupBallot };
	default:
		return {};
	}
}